

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddCustomTargetCommand.cxx
# Opt level: O3

bool cmAddCustomTargetCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  cmCustomCommand *pcVar1;
  pointer pbVar2;
  cmMakefile *pcVar3;
  pointer pcVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  undefined8 uVar8;
  size_type sVar9;
  string *a;
  long lVar10;
  cmTarget *this;
  uint uVar11;
  char *extraout_RDX;
  ulong uVar12;
  string *__x;
  byte bVar13;
  ulong uVar14;
  pointer pbVar15;
  byte bVar16;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string_view value;
  undefined1 auVar17 [16];
  __single_object cc;
  cmCustomCommandLine currentLine;
  string comment_buffer;
  cmCustomCommandLines commandLines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  byproducts;
  string job_server_aware;
  string job_pool;
  string working_directory;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  undefined1 local_260 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_240;
  undefined8 local_238;
  undefined8 local_230;
  char *local_228;
  undefined8 local_220;
  cmMakefile *local_218;
  pointer local_210;
  uint local_204;
  ulong local_200;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  char *local_1e0;
  char *local_1d8;
  undefined8 local_1d0;
  char local_1c8;
  undefined7 uStack_1c7;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_1b8;
  ulong local_1a0;
  undefined8 local_198;
  __uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_190;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_168;
  cmValue *local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  string local_148;
  char *local_128;
  undefined8 local_120;
  char local_118;
  undefined7 uStack_117;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  string local_d0;
  undefined1 local_b0 [56];
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pbVar2 == (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    local_260._0_8_ = local_260 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_260,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    local_b0._16_8_ = local_260._16_8_;
    local_b0._0_8_ = local_260._0_8_;
    if ((undefined1 *)local_260._0_8_ == local_260 + 0x10) {
      return false;
    }
LAB_0038bb3a:
    operator_delete((void *)local_b0._0_8_,
                    (ulong)((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_b0._16_8_)->_M_dataplus)._M_p + 1));
    return false;
  }
  pcVar3 = status->Makefile;
  auVar17 = std::__cxx11::string::find_first_of((char *)pbVar2,0x8aef34,0);
  if (auVar17._0_8_ != -1) {
    local_260._0_8_ = (pointer)0x21;
    local_260._8_8_ = "called with invalid target name \"";
    local_260._16_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_240 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (pbVar2->_M_dataplus)._M_p;
    local_260._24_8_ = pbVar2->_M_string_length;
    local_238 = 0;
    local_230 = 0x54;
    local_228 = 
    "\".  Target names may not contain a slash.  Use ADD_CUSTOM_COMMAND to generate files.";
    local_220 = 0;
    views._M_len = 3;
    views._M_array = (iterator)local_260;
    cmCatViews((string *)local_b0,views);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((undefined1 *)local_b0._0_8_ == local_b0 + 0x10) {
      return false;
    }
    goto LAB_0038bb3a;
  }
  local_1f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b8.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b8.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128 = &local_118;
  local_120 = 0;
  local_118 = '\0';
  local_1d8 = &local_1c8;
  local_1d0 = 0;
  local_1c8 = '\0';
  local_108.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  local_148._M_string_length = 0;
  local_148.field_2._M_local_buf[0] = '\0';
  local_168 = &local_158;
  local_160 = (cmValue *)0x0;
  local_158._M_local_buf[0] = '\0';
  pbVar15 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar7 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar15;
  uVar11 = 1;
  local_218 = pcVar3;
  local_210 = pbVar2;
  if (uVar7 < 0x21) {
    local_204 = (uint)CONCAT71(auVar17._9_7_,1);
  }
  else {
    iVar6 = std::__cxx11::string::compare((char *)(pbVar15 + 1));
    local_204 = (uint)(iVar6 != 0);
    uVar11 = 2 - local_204;
    pbVar15 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    uVar7 = (long)(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar15;
  }
  uVar12 = (ulong)uVar11;
  uVar14 = 0;
  if (uVar12 < (ulong)((long)uVar7 >> 5)) {
    local_198 = 0;
    local_1e0 = (char *)0x0;
    local_200 = 0;
    local_1a0 = 0;
LAB_0038bc7f:
    uVar11 = uVar11 + 1;
    __x = pbVar15 + uVar12;
    iVar6 = std::__cxx11::string::compare((char *)__x);
    uVar7 = 1;
    if (iVar6 != 0) {
      iVar6 = std::__cxx11::string::compare((char *)__x);
      uVar7 = 2;
      if (iVar6 != 0) {
        iVar6 = std::__cxx11::string::compare((char *)__x);
        uVar7 = 3;
        if (iVar6 != 0) {
          uVar8 = std::__cxx11::string::compare((char *)__x);
          if ((int)uVar8 == 0) {
            local_198 = CONCAT71((int7)((ulong)uVar8 >> 8),1);
          }
          else {
            uVar8 = std::__cxx11::string::compare((char *)__x);
            if ((int)uVar8 == 0) {
              local_1a0 = CONCAT71((int7)((ulong)uVar8 >> 8),1);
            }
            else {
              uVar8 = std::__cxx11::string::compare((char *)__x);
              if ((int)uVar8 != 0) {
                iVar6 = std::__cxx11::string::compare((char *)__x);
                if (iVar6 == 0) {
LAB_0038be77:
                  uVar7 = 4;
                }
                else {
                  iVar6 = std::__cxx11::string::compare((char *)__x);
                  if (iVar6 == 0) {
                    uVar7 = 6;
                  }
                  else {
                    iVar6 = std::__cxx11::string::compare((char *)__x);
                    if (iVar6 == 0) {
                      uVar7 = 7;
                    }
                    else {
                      iVar6 = std::__cxx11::string::compare((char *)__x);
                      if (iVar6 == 0) {
                        uVar7 = 0;
                        if (local_1f8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start !=
                            local_1f8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish) {
                          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
                          push_back(&local_1b8,(value_type *)&local_1f8);
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::_M_erase_at_end(&local_1f8,
                                            local_1f8.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                        }
                      }
                      else {
                        iVar6 = std::__cxx11::string::compare((char *)__x);
                        if (iVar6 == 0) {
                          uVar7 = 5;
                        }
                        else {
                          switch(uVar14) {
                          case 0:
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::push_back(&local_1f8,__x);
                            uVar7 = 0;
                            break;
                          case 1:
                            local_260._0_8_ = local_260 + 0x10;
                            pcVar4 = (__x->_M_dataplus)._M_p;
                            std::__cxx11::string::_M_construct<char*>
                                      ((string *)local_260,pcVar4,pcVar4 + __x->_M_string_length);
                            cmsys::SystemTools::ConvertToUnixSlashes((string *)local_260);
                            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                            emplace_back<std::__cxx11::string>
                                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                        *)&local_e8,(string *)local_260);
                            if ((cmCustomCommand *)local_260._0_8_ !=
                                (cmCustomCommand *)(local_260 + 0x10)) {
                              operator_delete((void *)local_260._0_8_,(ulong)(local_260._16_8_ + 1))
                              ;
                            }
                            uVar7 = 1;
                            break;
                          case 2:
                            local_260._0_8_ = local_260 + 0x10;
                            local_260._8_8_ = (char *)0x0;
                            local_260._16_8_ = local_260._16_8_ & 0xffffffffffffff00;
                            bVar5 = cmsys::SystemTools::FileIsFullPath(__x);
                            if ((!bVar5) && (sVar9 = cmGeneratorExpression::Find(__x), sVar9 != 0))
                            {
                              a = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(local_218);
                              local_d0._M_dataplus._M_p._0_1_ = 0x2f;
                              cmStrCat<std::__cxx11::string_const&,char>
                                        ((string *)local_b0,a,(char *)&local_d0);
                              std::__cxx11::string::operator=
                                        ((string *)local_260,(string *)local_b0);
                              if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
                                operator_delete((void *)local_b0._0_8_,(ulong)(local_b0._16_8_ + 1))
                                ;
                              }
                            }
                            std::__cxx11::string::_M_append
                                      ((char *)local_260,(ulong)(__x->_M_dataplus)._M_p);
                            cmsys::SystemTools::ConvertToUnixSlashes((string *)local_260);
                            bVar5 = cmsys::SystemTools::FileIsFullPath((string *)local_260);
                            if (bVar5) {
                              cmsys::SystemTools::CollapseFullPath
                                        ((string *)local_b0,(string *)local_260);
                              std::__cxx11::string::operator=
                                        ((string *)local_260,(string *)local_b0);
                              if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
                                operator_delete((void *)local_b0._0_8_,(ulong)(local_b0._16_8_ + 1))
                                ;
                              }
                            }
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::push_back(&local_188,(string *)local_260);
                            if ((cmCustomCommand *)local_260._0_8_ !=
                                (cmCustomCommand *)(local_260 + 0x10)) {
                              operator_delete((void *)local_260._0_8_,(ulong)(local_260._16_8_ + 1))
                              ;
                            }
                            uVar7 = 2;
                            break;
                          case 3:
                            std::__cxx11::string::_M_assign((string *)&local_128);
                            break;
                          case 4:
                            std::__cxx11::string::_M_assign((string *)&local_1d8);
                            local_1e0 = local_1d8;
                            goto LAB_0038be77;
                          case 5:
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::push_back(&local_108,__x);
                            uVar7 = 5;
                            break;
                          case 6:
                            std::__cxx11::string::_M_assign((string *)&local_148);
                            uVar7 = 6;
                            break;
                          case 7:
                            std::__cxx11::string::_M_assign((string *)&local_168);
                            uVar7 = 7;
                            break;
                          default:
                            local_260._0_8_ = local_260 + 0x10;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_260,"Wrong syntax. Unknown type of argument."
                                       ,"");
                            std::__cxx11::string::_M_assign((string *)&status->Error);
                            if ((cmCustomCommand *)local_260._0_8_ !=
                                (cmCustomCommand *)(local_260 + 0x10)) {
                              operator_delete((void *)local_260._0_8_,(ulong)(local_260._16_8_ + 1))
                              ;
                            }
                            bVar5 = false;
                            goto LAB_0038c2a9;
                          }
                        }
                      }
                    }
                  }
                }
                goto LAB_0038bde7;
              }
              local_200 = CONCAT71((int7)((ulong)uVar8 >> 8),1);
            }
          }
          uVar7 = 8;
        }
      }
    }
LAB_0038bde7:
    uVar14 = uVar7;
    uVar12 = (ulong)uVar11;
    pbVar15 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar15 >> 5) <= uVar12)
    goto LAB_0038c08a;
    goto LAB_0038bc7f;
  }
  local_200 = 0;
  local_1e0 = (char *)0x0;
  bVar16 = 1;
  goto LAB_0038c0ae;
LAB_0038c08a:
  bVar16 = (byte)local_198 ^ 1;
  uVar14 = local_1a0;
LAB_0038c0ae:
  pbVar2 = local_210;
  bVar13 = (byte)uVar14;
  lVar10 = std::__cxx11::string::find_first_of((char *)local_210,0x88fe8d,0);
  if (lVar10 == -1) {
    bVar5 = cmGeneratorExpression::IsValidTargetName(pbVar2);
    if ((((bVar5) && (bVar5 = cmGlobalGenerator::IsReservedTarget(local_210), !bVar5)) &&
        (lVar10 = std::__cxx11::string::find((char)local_210,0x3a), lVar10 == -1)) ||
       (bVar5 = cmMakefile::CheckCMP0037(local_218,local_210,UTILITY), bVar5)) {
      if (local_1f8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_1f8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                  (&local_1b8,(value_type *)&local_1f8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase_at_end(&local_1f8,
                          local_1f8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
      }
      pcVar1 = (cmCustomCommand *)(local_260 + 0x10);
      local_260._8_8_ = (char *)0x0;
      local_260._16_8_ = local_260._16_8_ & 0xffffffffffffff00;
      local_260._0_8_ = pcVar1;
      bVar5 = cmMakefile::EnforceUniqueName(local_218,local_210,(string *)local_260,true);
      if (bVar5) {
        if ((cmCustomCommand *)local_260._0_8_ != pcVar1) {
          operator_delete((void *)local_260._0_8_,(ulong)(local_260._16_8_ + 1));
        }
        if (local_1b8.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            local_1b8.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          if (local_188.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              local_188.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            if ((uVar14 & 1) == 0) {
              if ((local_200 & 1) == 0) {
                bVar13 = 0;
                goto LAB_0038c486;
              }
              local_260._0_8_ = pcVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_260,
                         "COMMAND_EXPAND_LISTS may not be specified without any COMMAND","");
              cmMakefile::IssueMessage(local_218,FATAL_ERROR,(string *)local_260);
            }
            else {
              local_260._0_8_ = pcVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_260,
                         "USES_TERMINAL may not be specified without any COMMAND","");
              cmMakefile::IssueMessage(local_218,FATAL_ERROR,(string *)local_260);
            }
          }
          else {
            local_260._0_8_ = pcVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_260,"BYPRODUCTS may not be specified without any COMMAND","")
            ;
            cmMakefile::IssueMessage(local_218,FATAL_ERROR,(string *)local_260);
          }
          if ((cmCustomCommand *)local_260._0_8_ != pcVar1) {
            operator_delete((void *)local_260._0_8_,(ulong)(local_260._16_8_ + 1));
          }
          bVar5 = true;
          goto LAB_0038c2a9;
        }
        if ((local_148._M_string_length != 0 & bVar13) != 1) {
LAB_0038c486:
          std::make_unique<cmCustomCommand>();
          cmCustomCommand::SetWorkingDirectory((cmCustomCommand *)local_260._0_8_,local_128);
          uVar8 = local_260._0_8_;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_48,&local_188);
          cmCustomCommand::SetByproducts((cmCustomCommand *)uVar8,&local_48);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_48);
          uVar8 = local_260._0_8_;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_60,&local_e8);
          cmCustomCommand::SetDepends((cmCustomCommand *)uVar8,&local_60);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_60);
          uVar8 = local_260._0_8_;
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
                    (&local_78,&local_1b8);
          cmCustomCommand::SetCommandLines
                    ((cmCustomCommand *)uVar8,(cmCustomCommandLines *)&local_78);
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_78)
          ;
          cmCustomCommand::SetEscapeOldStyle((cmCustomCommand *)local_260._0_8_,(bool)(bVar16 & 1));
          cmCustomCommand::SetComment((cmCustomCommand *)local_260._0_8_,local_1e0);
          cmCustomCommand::SetUsesTerminal((cmCustomCommand *)local_260._0_8_,(bool)(bVar13 & 1));
          cmCustomCommand::SetCommandExpandLists
                    ((cmCustomCommand *)local_260._0_8_,(bool)((byte)local_200 & 1));
          cmCustomCommand::SetJobPool((cmCustomCommand *)local_260._0_8_,&local_148);
          uVar8 = local_260._0_8_;
          value._M_str = extraout_RDX;
          value._M_len = (size_t)local_168;
          bVar5 = cmValue::IsOn(local_160,value);
          cmCustomCommand::SetJobserverAware((cmCustomCommand *)uVar8,bVar5);
          local_190._M_t.
          super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
          super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
               (tuple<cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>)
               (tuple<cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>)local_260._0_8_;
          local_260._0_8_ = (cmCustomCommand *)0x0;
          this = cmMakefile::AddUtilityCommand
                           (local_218,local_210,local_204._0_1_,
                            (unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                            &local_190);
          std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                    ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                     &local_190);
          cmTarget::AddSources(this,&local_108);
          std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                    ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)local_260
                    );
          bVar5 = true;
          goto LAB_0038c2a9;
        }
        local_260._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_260,"JOB_POOL is shadowed by USES_TERMINAL.","");
        std::__cxx11::string::_M_assign((string *)&status->Error);
      }
      else {
        std::__cxx11::string::_M_assign((string *)&status->Error);
      }
      if ((cmCustomCommand *)local_260._0_8_ != pcVar1) {
        operator_delete((void *)local_260._0_8_,(ulong)(local_260._16_8_ + 1));
      }
      bVar5 = false;
      goto LAB_0038c2a9;
    }
  }
  else {
    local_260._0_8_ = (cmCustomCommand *)0x26;
    local_260._8_8_ = "called with target name containing a \"";
    local_260._16_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_b0[0x18] = (pbVar2->_M_dataplus)._M_p[lVar10];
    local_240 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (local_b0 + 0x18);
    local_b0._0_8_ = (pointer)0x0;
    local_b0._8_8_ = 1;
    local_260._24_8_ = 1;
    local_238 = 0;
    local_230 = 0x22;
    local_228 = "\".  This character is not allowed.";
    local_220 = 0;
    views_00._M_len = 3;
    views_00._M_array = (iterator)local_260;
    local_b0._16_8_ = local_240;
    cmCatViews(&local_d0,views_00);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_d0._M_dataplus._M_p._1_7_,local_d0._M_dataplus._M_p._0_1_) !=
        &local_d0.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_d0._M_dataplus._M_p._1_7_,local_d0._M_dataplus._M_p._0_1_),
                      local_d0.field_2._M_allocated_capacity + 1);
    }
  }
  bVar5 = false;
LAB_0038c2a9:
  if (local_168 != &local_158) {
    operator_delete(local_168,
                    CONCAT71(local_158._M_allocated_capacity._1_7_,local_158._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,
                    CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                             local_148.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_108);
  if (local_1d8 != &local_1c8) {
    operator_delete(local_1d8,CONCAT71(uStack_1c7,local_1c8) + 1);
  }
  if (local_128 != &local_118) {
    operator_delete(local_128,CONCAT71(uStack_117,local_118) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_188);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e8);
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_1b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1f8);
  return bVar5;
}

Assistant:

bool cmAddCustomTargetCommand(std::vector<std::string> const& args,
                              cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  cmMakefile& mf = status.GetMakefile();
  std::string const& targetName = args[0];

  // Check the target name.
  if (targetName.find_first_of("/\\") != std::string::npos) {
    status.SetError(cmStrCat("called with invalid target name \"", targetName,
                             "\".  Target names may not contain a slash.  "
                             "Use ADD_CUSTOM_COMMAND to generate files."));
    return false;
  }

  // Accumulate one command line at a time.
  cmCustomCommandLine currentLine;

  // Save all command lines.
  cmCustomCommandLines commandLines;

  // Accumulate dependencies.
  std::vector<std::string> depends;
  std::vector<std::string> byproducts;
  std::string working_directory;
  bool verbatim = false;
  bool uses_terminal = false;
  bool command_expand_lists = false;
  std::string comment_buffer;
  const char* comment = nullptr;
  std::vector<std::string> sources;
  std::string job_pool;
  std::string job_server_aware;

  // Keep track of parser state.
  enum tdoing
  {
    doing_command,
    doing_depends,
    doing_byproducts,
    doing_working_directory,
    doing_comment,
    doing_source,
    doing_job_pool,
    doing_job_server_aware,
    doing_nothing
  };
  tdoing doing = doing_command;

  // Look for the ALL option.
  bool excludeFromAll = true;
  unsigned int start = 1;
  if (args.size() > 1) {
    if (args[1] == "ALL") {
      excludeFromAll = false;
      start = 2;
    }
  }

  // Parse the rest of the arguments.
  for (unsigned int j = start; j < args.size(); ++j) {
    std::string const& copy = args[j];

    if (copy == "DEPENDS") {
      doing = doing_depends;
    } else if (copy == "BYPRODUCTS") {
      doing = doing_byproducts;
    } else if (copy == "WORKING_DIRECTORY") {
      doing = doing_working_directory;
    } else if (copy == "VERBATIM") {
      doing = doing_nothing;
      verbatim = true;
    } else if (copy == "USES_TERMINAL") {
      doing = doing_nothing;
      uses_terminal = true;
    } else if (copy == "COMMAND_EXPAND_LISTS") {
      doing = doing_nothing;
      command_expand_lists = true;
    } else if (copy == "COMMENT") {
      doing = doing_comment;
    } else if (copy == "JOB_POOL") {
      doing = doing_job_pool;
    } else if (copy == "JOB_SERVER_AWARE") {
      doing = doing_job_server_aware;
    } else if (copy == "COMMAND") {
      doing = doing_command;

      // Save the current command before starting the next command.
      if (!currentLine.empty()) {
        commandLines.push_back(currentLine);
        currentLine.clear();
      }
    } else if (copy == "SOURCES") {
      doing = doing_source;
    } else {
      switch (doing) {
        case doing_working_directory:
          working_directory = copy;
          break;
        case doing_command:
          currentLine.push_back(copy);
          break;
        case doing_byproducts: {
          std::string filename;
          if (!cmSystemTools::FileIsFullPath(copy) &&
              cmGeneratorExpression::Find(copy) != 0) {
            filename = cmStrCat(mf.GetCurrentBinaryDirectory(), '/');
          }
          filename += copy;
          cmSystemTools::ConvertToUnixSlashes(filename);
          if (cmSystemTools::FileIsFullPath(filename)) {
            filename = cmSystemTools::CollapseFullPath(filename);
          }
          byproducts.push_back(filename);
        } break;
        case doing_depends: {
          std::string dep = copy;
          cmSystemTools::ConvertToUnixSlashes(dep);
          depends.push_back(std::move(dep));
        } break;
        case doing_comment:
          comment_buffer = copy;
          comment = comment_buffer.c_str();
          break;
        case doing_source:
          sources.push_back(copy);
          break;
        case doing_job_pool:
          job_pool = copy;
          break;
        case doing_job_server_aware:
          job_server_aware = copy;
          break;
        default:
          status.SetError("Wrong syntax. Unknown type of argument.");
          return false;
      }
    }
  }

  std::string::size_type pos = targetName.find_first_of("#<>");
  if (pos != std::string::npos) {
    status.SetError(cmStrCat("called with target name containing a \"",
                             targetName[pos],
                             "\".  This character is not allowed."));
    return false;
  }

  // Some requirements on custom target names already exist
  // and have been checked at this point.
  // The following restrictions overlap but depend on policy CMP0037.
  bool nameOk = cmGeneratorExpression::IsValidTargetName(targetName) &&
    !cmGlobalGenerator::IsReservedTarget(targetName);
  if (nameOk) {
    nameOk = targetName.find(':') == std::string::npos;
  }
  if (!nameOk && !mf.CheckCMP0037(targetName, cmStateEnums::UTILITY)) {
    return false;
  }

  // Store the last command line finished.
  if (!currentLine.empty()) {
    commandLines.push_back(currentLine);
    currentLine.clear();
  }

  // Enforce name uniqueness.
  {
    std::string msg;
    if (!mf.EnforceUniqueName(targetName, msg, true)) {
      status.SetError(msg);
      return false;
    }
  }

  if (commandLines.empty() && !byproducts.empty()) {
    mf.IssueMessage(MessageType::FATAL_ERROR,
                    "BYPRODUCTS may not be specified without any COMMAND");
    return true;
  }
  if (commandLines.empty() && uses_terminal) {
    mf.IssueMessage(MessageType::FATAL_ERROR,
                    "USES_TERMINAL may not be specified without any COMMAND");
    return true;
  }
  if (commandLines.empty() && command_expand_lists) {
    mf.IssueMessage(
      MessageType::FATAL_ERROR,
      "COMMAND_EXPAND_LISTS may not be specified without any COMMAND");
    return true;
  }

  if (uses_terminal && !job_pool.empty()) {
    status.SetError("JOB_POOL is shadowed by USES_TERMINAL.");
    return false;
  }

  // Add the utility target to the makefile.
  auto cc = cm::make_unique<cmCustomCommand>();
  cc->SetWorkingDirectory(working_directory.c_str());
  cc->SetByproducts(byproducts);
  cc->SetDepends(depends);
  cc->SetCommandLines(commandLines);
  cc->SetEscapeOldStyle(!verbatim);
  cc->SetComment(comment);
  cc->SetUsesTerminal(uses_terminal);
  cc->SetCommandExpandLists(command_expand_lists);
  cc->SetJobPool(job_pool);
  cc->SetJobserverAware(cmIsOn(job_server_aware));
  cmTarget* target =
    mf.AddUtilityCommand(targetName, excludeFromAll, std::move(cc));

  // Add additional user-specified source files to the target.
  target->AddSources(sources);

  return true;
}